

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

int __thiscall ghc::filesystem::path::compare(path *this,value_type *s)

{
  int iVar1;
  format fmt;
  ulong uVar3;
  allocator<char> local_59;
  impl_string_type local_58;
  long *local_38;
  long local_30;
  long local_28 [2];
  long *plVar2;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,s,&local_59);
  plVar2 = local_38;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_58,local_38,local_30 + (long)local_38);
  fmt = (format)plVar2;
  if (local_38 != local_28) {
    uVar3 = local_28[0] + 1;
    operator_delete(local_38,uVar3);
    fmt = (format)uVar3;
  }
  postprocess_path_with_format(&local_58,fmt);
  iVar1 = std::__cxx11::string::compare((string *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

GHC_INLINE int path::compare(const value_type* s) const
{
    return native().compare(path(s).native());
}